

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Cpu.cpp
# Opt level: O2

void __thiscall Nes_Cpu::reset(Nes_Cpu *this,void *unmapped_page)

{
  uint page;
  long lVar1;
  
  this->state = &this->state_;
  (this->r).sp = 0xff;
  (this->r).pc = 0;
  (this->r).a = '\0';
  (this->r).x = '\0';
  (this->r).y = '\0';
  (this->r).status = '\x04';
  (this->state_).base = 0;
  (this->state_).time = 0;
  this->irq_time_ = 0x40000000;
  this->end_time_ = 0x40000000;
  this->error_count_ = 0;
  (this->state_).code_map[0x20] = (uint8_t *)unmapped_page;
  for (lVar1 = 4; (int)lVar1 != 0x20; lVar1 = lVar1 + 1) {
    this->state->code_map[lVar1] = (uint8_t *)unmapped_page;
  }
  for (lVar1 = 0; (int)lVar1 != 4; lVar1 = lVar1 + 1) {
    this->state->code_map[lVar1] = this->low_mem;
  }
  return;
}

Assistant:

void Nes_Cpu::reset( void const* unmapped_page )
{
	check( state == &state_ );
	state = &state_;
	r.status = st_i;
	r.sp = 0xFF;
	r.pc = 0;
	r.a  = 0;
	r.x  = 0;
	r.y  = 0;
	state_.time = 0;
	state_.base = 0;
	irq_time_ = future_nes_time;
	end_time_ = future_nes_time;
	error_count_ = 0;
	
	assert( page_size == 0x800 ); // assumes this
	set_code_page( page_count, unmapped_page );
	map_code( 0x2000, 0xE000, unmapped_page, true );
	map_code( 0x0000, 0x2000, low_mem, true );
	
	blargg_verify_byte_order();
}